

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

unique_ptr<ninx::parser::element::FunctionCall,_std::default_delete<ninx::parser::element::FunctionCall>_>
 __thiscall ninx::parser::Parser::parse_operator_call(Parser *this,char limiter)

{
  TokenReader *this_00;
  int iVar1;
  mapped_type *pmVar2;
  undefined8 extraout_RAX;
  char in_DL;
  undefined7 in_register_00000031;
  Parser *this_01;
  char limiter_local;
  undefined1 local_99;
  _Head_base<0UL,_ninx::parser::element::Block_*,_false> local_98;
  undefined1 local_90 [8];
  vector<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
  arguments;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  mapped_type name;
  
  this_01 = (Parser *)CONCAT71(in_register_00000031,limiter);
  this_00 = &this_01->reader;
  iVar1 = TokenReader::check_limiter(this_00,in_DL);
  if (iVar1 == 1) {
    TokenReader::get_token(this_00);
    parse_implicit_block_until((Parser *)local_90,limiter);
    iVar1 = TokenReader::check_limiter(this_00,in_DL);
    if (iVar1 == 1) {
      TokenReader::get_token(this_00);
      pmVar2 = std::__detail::
               _Map_base<char,_std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::at((_Map_base<char,_std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     *)&this_01->operators,&limiter_local);
      std::__cxx11::string::string((string *)&name,(string *)pmVar2);
      arguments.
      super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      arguments.
      super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      arguments.
      super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::make_unique<std::__cxx11::string,char_const(&)[5]>((char (*) [5])&local_98);
      std::
      make_unique<ninx::parser::element::FunctionCallArgument,std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>,std::unique_ptr<ninx::parser::element::Block,std::default_delete<ninx::parser::element::Block>>>
                ((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_60,
                 (unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
                  *)&local_98);
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_98);
      std::
      vector<std::unique_ptr<ninx::parser::element::FunctionCallArgument,std::default_delete<ninx::parser::element::FunctionCallArgument>>,std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,std::default_delete<ninx::parser::element::FunctionCallArgument>>>>
      ::
      emplace_back<std::unique_ptr<ninx::parser::element::FunctionCallArgument,std::default_delete<ninx::parser::element::FunctionCallArgument>>>
                ((vector<std::unique_ptr<ninx::parser::element::FunctionCallArgument,std::default_delete<ninx::parser::element::FunctionCallArgument>>,std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,std::default_delete<ninx::parser::element::FunctionCallArgument>>>>
                  *)&arguments,
                 (unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
                  *)&local_60);
      local_98._M_head_impl = (Block *)0x0;
      local_99 = 0;
      std::
      make_unique<ninx::parser::element::FunctionCall,std::__cxx11::string&,std::vector<std::unique_ptr<ninx::parser::element::FunctionCallArgument,std::default_delete<ninx::parser::element::FunctionCallArgument>>,std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,std::default_delete<ninx::parser::element::FunctionCallArgument>>>>,decltype(nullptr),bool>
                (&this->origin,
                 (vector<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
                  *)&name,(void **)&arguments,(bool *)&local_98);
      if ((__buckets_ptr)local_60._M_dataplus._M_p != (__buckets_ptr)0x0) {
        (*(code *)(*(__node_base_ptr *)local_60._M_dataplus._M_p)[1]._M_nxt)();
      }
      std::
      vector<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
      ::~vector(&arguments);
      std::__cxx11::string::~string((string *)&name);
      if (local_90 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_90 + 8))();
      }
      return (__uniq_ptr_data<ninx::parser::element::FunctionCall,_std::default_delete<ninx::parser::element::FunctionCall>,_true,_true>
              )(__uniq_ptr_data<ninx::parser::element::FunctionCall,_std::default_delete<ninx::parser::element::FunctionCall>,_true,_true>
                )this;
    }
  }
  else {
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_60,'\x01');
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&arguments,
                   "Expected operator \'",&local_60);
    std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &arguments,"\', but could not find one.");
    generate_exception(this_01,&name);
  }
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_60,'\x01');
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&arguments,
                 "Expected closing operator \'",&local_60);
  std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &arguments,"\', but could not find one.");
  generate_exception(this_01,&name);
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::~string((string *)&arguments);
  std::__cxx11::string::~string((string *)&local_60);
  if (local_90 != (undefined1  [8])0x0) {
    (**(code **)(*(long *)local_90 + 8))();
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

std::unique_ptr<FunctionCall> ninx::parser::Parser::parse_operator_call(char limiter) {
    if (reader.check_limiter(limiter) != 1) {
        generate_exception("Expected operator '" + std::string(1, limiter) + "', but could not find one.");
    }
    reader.get_token();

    auto body {parse_implicit_block_until(limiter)};

    if (reader.check_limiter(limiter) != 1) {
        generate_exception("Expected closing operator '" + std::string(1, limiter) + "', but could not find one.");
    }
    reader.get_token();

    // Get the name of the function the operator refers to
    auto name {operators.at(limiter)};

    // Create the function call
    std::vector<std::unique_ptr<FunctionCallArgument>> arguments;
    auto argument = std::make_unique<FunctionCallArgument>(std::make_unique<std::string>("body"), std::move(body));
    arguments.push_back(std::move(argument));

    auto function_call = std::make_unique<FunctionCall>(name, std::move(arguments),
                                                        nullptr, false);

    return function_call;
}